

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvn.h
# Opt level: O1

cmplx __thiscall klogic::mvn::output(mvn *this,cvector *X)

{
  uint uVar1;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  double __z;
  double dVar4;
  cmplx cVar5;
  
  uVar1 = this->k;
  weighted_sum(this,(X->
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    )._M_impl.super__Vector_impl_data._M_start,
               (X->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
               ._M_impl.super__Vector_impl_data._M_finish);
  if (uVar1 == 0) {
    cabs(__z);
    uVar2 = extraout_RAX_00;
    uVar3 = extraout_RDX_00;
  }
  else {
    dVar4 = carg(__z);
    dVar4 = floor(((double)(~-(ulong)(dVar4 < 0.0) & (ulong)dVar4 |
                           (ulong)(dVar4 + 6.283185307179586) & -(ulong)(dVar4 < 0.0)) /
                  6.283185307179586) * (double)(int)uVar1);
    if (((int)uVar1 < 1) || (uVar1 <= (uint)(int)(dVar4 + 0.5))) {
      __assert_fail("k > 0 && n >= 0 && n < k",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/be9[P]mlmvn/test/../lib/klogic.h"
                    ,0x11,"cmplx klogic::epsilon(unsigned int, int)");
    }
    dVar4 = ((double)(int)(dVar4 + 0.5) * 6.283185307179586) / (double)(int)uVar1;
    cos(dVar4);
    sin(dVar4);
    uVar2 = extraout_RAX;
    uVar3 = extraout_RDX;
  }
  cVar5._M_value._8_8_ = uVar3;
  cVar5._M_value._0_8_ = uVar2;
  return (cmplx)cVar5._M_value;
}

Assistant:

cmplx output(const cvector &X) const {
            return activation(k, weighted_sum(X.begin(), X.end()));
        }